

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloter_interface.h
# Opt level: O3

shared_ptr<cppnet::BufferBlock> __thiscall
cppnet::AlloterWrap::PoolNewSharePtr<cppnet::BufferBlock,std::shared_ptr<cppnet::BlockMemoryPool>&>
          (AlloterWrap *this,shared_ptr<cppnet::BlockMemoryPool> *args)

{
  element_type *peVar1;
  int iVar2;
  undefined4 extraout_var;
  shared_ptr<cppnet::BlockMemoryPool> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<cppnet::BufferBlock> sVar3;
  BufferBlock *this_00;
  
  peVar1 = (args->super___shared_ptr<cppnet::BlockMemoryPool,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  iVar2 = (*peVar1->_vptr_BlockMemoryPool[3])(peVar1,0x70);
  this_00 = (BufferBlock *)CONCAT44(extraout_var,iVar2);
  if (this_00 != (BufferBlock *)0x0) {
    BufferBlock::BufferBlock(this_00,in_RDX);
  }
  (this->_alloter).super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<cppnet::BufferBlock*,cppnet::AlloterWrap::PoolNewSharePtr<cppnet::BufferBlock,std::shared_ptr<cppnet::BlockMemoryPool>&>(std::shared_ptr<cppnet::BlockMemoryPool>&)::_lambda(cppnet::BufferBlock*)_1_,std::allocator<void>,void>
            (&(this->_alloter).super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,this_00,args);
  sVar3.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<cppnet::BufferBlock>)
         sVar3.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> AlloterWrap::PoolNewSharePtr(Args&&... args) {
    T* ret = PoolNew<T>(std::forward<Args>(args)...);
    return std::shared_ptr<T>(ret, [this](T* c) { PoolDelete(c); });
}